

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

bool operator==(Vehicle *a,Vehicle *b)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  pointer a_00;
  Vehicle *in_RSI;
  Vehicle *in_RDI;
  Vehicle *in_stack_ffffffffffffff78;
  unique_ptr<Person,_std::default_delete<Person>_> *in_stack_ffffffffffffff80;
  bool local_6e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_38 [32];
  Vehicle *local_18;
  Vehicle *local_10;
  bool local_1;
  
  bVar2 = false;
  bVar1 = false;
  local_6e = false;
  if (in_RDI->type == in_RSI->type) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar4 = Vehicle::age(in_RDI);
    iVar5 = Vehicle::age(local_18);
    local_6e = false;
    if (iVar4 == iVar5) {
      Vehicle::name_abi_cxx11_(in_stack_ffffffffffffff78);
      bVar2 = true;
      Vehicle::name_abi_cxx11_(in_stack_ffffffffffffff78);
      bVar1 = true;
      _Var3 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_6e = false;
      if (_Var3) {
        Vehicle::owner(local_10);
        a_00 = std::unique_ptr<Person,_std::default_delete<Person>_>::get(in_stack_ffffffffffffff80)
        ;
        Vehicle::owner(local_18);
        std::unique_ptr<Person,_std::default_delete<Person>_>::get
                  ((unique_ptr<Person,_std::default_delete<Person>_> *)a_00);
        local_6e = anon_unknown.dwarf_66e92::pointee_equal<Person>
                             (a_00,(Person *)in_stack_ffffffffffffff78);
      }
    }
  }
  local_1 = local_6e;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  }
  if (bVar2) {
    std::__cxx11::string::~string(local_38);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool operator==(const Vehicle& a, const Vehicle& b)
  {
    return a.type == b.type
      &&   a.age() == b.age()
      &&   a.name() == b.name()
      &&   pointee_equal(a.owner().get(), b.owner().get());
  }